

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_protocol.cpp
# Opt level: O2

void ReadTicCmd(BYTE **stream,int player,int tic)

{
  usercmd_t *ucmd;
  ticcmd_t *ptVar1;
  byte bVar2;
  ushort uVar3;
  int iVar4;
  ushort *puVar5;
  ushort *data;
  usercmd_t *basis;
  DWORD DVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  
  iVar4 = tic % 0x24;
  ucmd = &netcmds[player][iVar4].ucmd;
  uVar3 = *(ushort *)*stream;
  data = (ushort *)((long)*stream + 2);
  *stream = (BYTE *)data;
  netcmds[player][iVar4].consistancy = uVar3 << 8 | uVar3 >> 8;
  puVar5 = data;
  while( true ) {
    bVar2 = (byte)*puVar5;
    *stream = (byte *)((long)puVar5 + 1);
    if (0xfffffffd < bVar2 - 3) break;
    Net_SkipCommand((uint)bVar2,stream);
    puVar5 = (ushort *)*stream;
  }
  FDynamicBuffer::SetData(NetSpecs[player] + iVar4,(BYTE *)data,(int)puVar5 - (int)data);
  if (bVar2 == 1) {
    if (tic == 0) {
      basis = (usercmd_t *)0x0;
    }
    else {
      basis = &netcmds[player][(tic + -1) % 0x24].ucmd;
    }
    UnpackUserCmd(ucmd,basis,stream);
  }
  else {
    if (tic == 0) {
      DVar6 = 0;
      uVar7 = 0;
      uVar8 = 0;
      uVar9 = 0;
    }
    else {
      ptVar1 = netcmds[player] + (tic + -1) % 0x24;
      DVar6 = (ptVar1->ucmd).buttons;
      uVar7._0_2_ = (ptVar1->ucmd).pitch;
      uVar7._2_2_ = (ptVar1->ucmd).yaw;
      uVar8._0_2_ = (ptVar1->ucmd).roll;
      uVar8._2_2_ = (ptVar1->ucmd).forwardmove;
      uVar9._0_2_ = (ptVar1->ucmd).sidemove;
      uVar9._2_2_ = (ptVar1->ucmd).upmove;
    }
    ucmd->buttons = DVar6;
    ucmd->pitch = (short)uVar7;
    ucmd->yaw = (short)((uint)uVar7 >> 0x10);
    ucmd->roll = (short)uVar8;
    ucmd->forwardmove = (short)((uint)uVar8 >> 0x10);
    ucmd->sidemove = (short)uVar9;
    ucmd->upmove = (short)((uint)uVar9 >> 0x10);
  }
  if (((0x24 < tic) && (consoleplayer == player)) &&
     (consistancy[player][iVar4] != (short)ucmd[1].buttons)) {
    __assert_fail("consistancy[player][ticmod] == tcmd->consistancy",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/d_protocol.cpp"
                  ,0x1bb,"void ReadTicCmd(BYTE **, int, int)");
  }
  return;
}

Assistant:

void ReadTicCmd (BYTE **stream, int player, int tic)
{
	int type;
	BYTE *start;
	ticcmd_t *tcmd;

	int ticmod = tic % BACKUPTICS;

	tcmd = &netcmds[player][ticmod];
	tcmd->consistancy = ReadWord (stream);

	start = *stream;

	while ((type = ReadByte (stream)) != DEM_USERCMD && type != DEM_EMPTYUSERCMD)
		Net_SkipCommand (type, stream);

	NetSpecs[player][ticmod].SetData (start, int(*stream - start - 1));

	if (type == DEM_USERCMD)
	{
		UnpackUserCmd (&tcmd->ucmd,
			tic ? &netcmds[player][(tic-1)%BACKUPTICS].ucmd : NULL, stream);
	}
	else
	{
		if (tic)
		{
			memcpy (&tcmd->ucmd, &netcmds[player][(tic-1)%BACKUPTICS].ucmd, sizeof(tcmd->ucmd));
		}
		else
		{
			memset (&tcmd->ucmd, 0, sizeof(tcmd->ucmd));
		}
	}

	if (player==consoleplayer&&tic>BACKUPTICS)
		assert(consistancy[player][ticmod] == tcmd->consistancy);
}